

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
run_main_loop(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
              *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  
  lock._8_8_ = this;
  st_reusable_stuff::real_activity_tracker_t::wait_started(&this->m_activity_tracker);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_20,&(this->m_sync_objects).m_lock);
  while( true ) {
    process_final_deregs_if_any(this,(unique_lock<std::mutex> *)local_20);
    perform_shutdown_related_actions_if_needed(this,(unique_lock<std::mutex> *)local_20);
    if (this->m_shutdown_status == completed) break;
    handle_expired_timers_if_any(this,(unique_lock<std::mutex> *)local_20);
    try_handle_next_demand(this,(unique_lock<std::mutex> *)local_20);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::run_main_loop()
	{
		// Assume that waiting for new demands is started.
		// This call is necessary because if there is a demand
		// in event queue then m_activity_tracker.wait_stopped() will be
		// called without previous m_activity_tracker.wait_started().
		m_activity_tracker.wait_started();

		// Acquire the main lock for the first time.
		// It will be released and reacquired many times later.
		std::unique_lock< std::mutex > lock( m_sync_objects.m_lock );
		for(;;)
			{
				// The first step: all pending final deregs must be processed.
				process_final_deregs_if_any( lock );

				// There can be pending shutdown operation. It must be handled.
				perform_shutdown_related_actions_if_needed( lock );
				if( shutdown_status_t::completed == m_shutdown_status )
					break;

				// The next step: all timers must be converted to events.
				handle_expired_timers_if_any( lock );

				// The last step: an attempt to process demand.
				// Or sleep for some time until next demand arrived.
				try_handle_next_demand( lock );
			}
	}